

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipmerge.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  FILE *pFVar2;
  char *pcVar3;
  uint uVar4;
  undefined8 uVar5;
  zip_t *pzVar6;
  int iVar7;
  undefined1 local_50 [8];
  zip_error_t error;
  char *tname;
  uint n;
  uint i;
  int err;
  int c;
  zip_t **zs;
  zip_t *za;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  progname = *argv;
  confirm = 1;
  name_flags = 0;
  za = (zip_t *)argv;
  argv_local._0_4_ = argc;
  while (i = getopt((int)argv_local,(char **)za,"hVDiIsS"), i != 0xffffffff) {
    switch(i) {
    case 0x44:
      name_flags = name_flags | 2;
      break;
    default:
      fprintf(_stderr,"usage: %s [-DhIiSsV] target-zip zip...\n",progname);
      exit(2);
    case 0x49:
      name_flags = name_flags | 1;
      break;
    case 0x53:
      confirm = confirm & 0xffffffefU | 0x20;
      break;
    case 0x56:
      fputs(version_string,_stdout);
      exit(0);
    case 0x68:
      fputs(help_head,_stdout);
      printf("usage: %s [-DhIiSsV] target-zip zip...\n",progname);
      fputs(help,_stdout);
      exit(0);
    case 0x69:
      confirm = confirm & 0xfffffffe;
      break;
    case 0x73:
      confirm = confirm & 0xffffffdfU | 0x10;
    }
  }
  if ((int)argv_local < _optind + 2) {
    fprintf(_stderr,"usage: %s [-DhIiSsV] target-zip zip...\n",progname);
    exit(2);
  }
  iVar7 = _optind + 1;
  error.str = *(char **)(za + (long)_optind * 8);
  za = za + (long)iVar7 * 8;
  uVar4 = (int)argv_local - iVar7;
  _optind = iVar7;
  _err = malloc((ulong)uVar4 << 3);
  if (_err == (void *)0x0) {
    fprintf(_stderr,"%s: out of memory\n",progname);
    exit(1);
  }
  zs = (zip_t **)zip_open(error.str,1,&n);
  if (zs != (zip_t **)0x0) {
    tname._4_4_ = 0;
    while( true ) {
      if (uVar4 <= tname._4_4_) {
        iVar7 = zip_close();
        pcVar3 = error.str;
        pFVar2 = _stderr;
        pcVar1 = progname;
        if (iVar7 < 0) {
          uVar5 = zip_strerror(zs);
          fprintf(pFVar2,"%s: cannot write zip archive \'%s\': %s\n",pcVar1,pcVar3,uVar5);
          exit(1);
        }
        for (tname._4_4_ = 0; tname._4_4_ < uVar4; tname._4_4_ = tname._4_4_ + 1) {
          zip_close();
        }
        exit(0);
      }
      pzVar6 = merge_zip((zip_t *)zs,error.str,*(char **)(za + (ulong)tname._4_4_ * 8));
      *(zip_t **)((long)_err + (ulong)tname._4_4_ * 8) = pzVar6;
      if (pzVar6 == (zip_t *)0x0) break;
      tname._4_4_ = tname._4_4_ + 1;
    }
    exit(1);
  }
  zip_error_init_with_code(local_50,n);
  pcVar3 = error.str;
  pFVar2 = _stderr;
  pcVar1 = progname;
  uVar5 = zip_error_strerror(local_50);
  fprintf(pFVar2,"%s: can\'t open zip archive \'%s\': %s\n",pcVar1,pcVar3,uVar5);
  zip_error_fini(local_50);
  exit(1);
}

Assistant:

int
main(int argc, char *argv[]) {
    zip_t *za;
    zip_t **zs;
    int c, err;
    unsigned int i, n;
    char *tname;

    progname = argv[0];

    confirm = CONFIRM_ALL_YES;
    name_flags = 0;

    while ((c = getopt(argc, argv, OPTIONS)) != -1) {
	switch (c) {
	case 'D':
	    name_flags |= ZIP_FL_NODIR;
	    break;
	case 'i':
	    confirm &= ~CONFIRM_ALL_YES;
	    break;
	case 'I':
	    name_flags |= ZIP_FL_NOCASE;
	    break;
	case 's':
	    confirm &= ~CONFIRM_SAME_NO;
	    confirm |= CONFIRM_SAME_YES;
	    break;
	case 'S':
	    confirm &= ~CONFIRM_SAME_YES;
	    confirm |= CONFIRM_SAME_NO;
	    break;

	case 'h':
	    fputs(help_head, stdout);
	    printf(USAGE, progname);
	    fputs(help, stdout);
	    exit(0);
	case 'V':
	    fputs(version_string, stdout);
	    exit(0);

	default:
	    fprintf(stderr, USAGE, progname);
	    exit(2);
	}
    }

    if (argc < optind + 2) {
	fprintf(stderr, USAGE, progname);
	exit(2);
    }

    tname = argv[optind++];
    argv += optind;

    n = (unsigned int)(argc - optind);
    if ((zs = (zip_t **)malloc(sizeof(zs[0]) * n)) == NULL) {
	fprintf(stderr, "%s: out of memory\n", progname);
	exit(1);
    }

    if ((za = zip_open(tname, ZIP_CREATE, &err)) == NULL) {
	zip_error_t error;
	zip_error_init_with_code(&error, err);
	fprintf(stderr, "%s: can't open zip archive '%s': %s\n", progname, tname, zip_error_strerror(&error));
	zip_error_fini(&error);
	exit(1);
    }

    for (i = 0; i < n; i++) {
	if ((zs[i] = merge_zip(za, tname, argv[i])) == NULL)
	    exit(1);
    }

    if (zip_close(za) < 0) {
	fprintf(stderr, "%s: cannot write zip archive '%s': %s\n", progname, tname, zip_strerror(za));
	exit(1);
    }

    for (i = 0; i < n; i++)
	zip_close(zs[i]);

    exit(0);
}